

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O1

FT_Fixed PS_Conv_ToFixed(FT_Byte **cursor,FT_Byte *limit,FT_Long power_ten)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  FT_Long FVar5;
  long lVar6;
  long a_;
  long lVar7;
  undefined8 in_R11;
  undefined8 uVar8;
  ulong uVar9;
  bool bVar10;
  FT_Byte *p;
  byte *local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  local_50 = *cursor;
  if (limit <= local_50) {
    return 0;
  }
  bVar2 = *local_50;
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    local_50 = local_50 + 1;
    if (local_50 == limit) {
      return 0;
    }
    bVar10 = bVar2 == 0x2d;
    if (*local_50 == 0x2b) {
      return 0;
    }
    if (*local_50 == 0x2d) {
      return 0;
    }
  }
  else {
    bVar10 = false;
  }
  pbVar1 = local_50;
  if (*local_50 == 0x2e) {
    uVar4 = 0;
  }
  else {
    uVar4 = PS_Conv_ToInt(&local_50,limit);
    if (local_50 == pbVar1) {
      return 0;
    }
    uVar8 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
    if (0x7fff < (long)uVar4) goto LAB_002346d5;
    uVar4 = (ulong)(uint)((int)uVar4 << 0x10);
  }
  uVar8 = 0;
LAB_002346d5:
  lVar7 = 1;
  if ((local_50 < limit) && (*local_50 == 0x2e)) {
    a_ = 0;
    do {
      local_50 = local_50 + 1;
      pbVar1 = limit;
      if (limit <= local_50) break;
      uVar9 = (ulong)*local_50;
      if ((((uVar9 < 0x21) && ((0x100003601U >> (uVar9 & 0x3f) & 1) != 0)) ||
          ((char)*local_50 < '\0')) || (uVar9 - 0x3a < 0xfffffffffffffff6)) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if ((lVar7 < 0xccccccc) && (a_ < 0xccccccc)) {
          a_ = (long)ft_char_table[uVar9] + a_ * 10;
          if (power_ten < 1 || uVar4 != 0) {
            lVar7 = lVar7 * 10;
          }
          else {
            power_ten = power_ten + -1;
          }
        }
      }
      pbVar1 = local_50;
    } while (bVar3);
  }
  else {
    a_ = 0;
    pbVar1 = local_50;
  }
  local_50 = pbVar1;
  pbVar1 = local_50 + 1;
  if ((pbVar1 < limit) && ((*local_50 | 0x20) == 0x65)) {
    local_50 = pbVar1;
    local_48 = a_;
    local_40 = lVar7;
    local_38 = uVar8;
    FVar5 = PS_Conv_ToInt(&local_50,limit);
    uVar8 = local_38;
    if (pbVar1 == local_50) {
      bVar3 = false;
    }
    else if (FVar5 < 0x3e9) {
      bVar3 = FVar5 < -1000;
      lVar7 = 0;
      if (-0x3e9 < FVar5) {
        lVar7 = FVar5;
      }
      power_ten = power_ten + lVar7;
    }
    else {
      bVar3 = false;
      uVar8 = 1;
    }
    a_ = local_48;
    lVar7 = local_40;
    if (pbVar1 == local_50) {
      return 0;
    }
  }
  else {
    bVar3 = false;
  }
  *cursor = local_50;
  if (uVar4 == 0 && a_ == 0) {
    return 0;
  }
  uVar9 = 0x7fffffff;
  if ((char)uVar8 == '\0') {
    if (bVar3) {
      return 0;
    }
    if (0 < power_ten) {
      lVar6 = power_ten + 1;
      do {
        if (0xccccccb < uVar4) goto LAB_0023483c;
        if (a_ < 0xccccccc) {
          a_ = a_ * 10;
        }
        else {
          if (lVar7 == 1) goto LAB_0023483c;
          lVar7 = lVar7 / 10;
        }
        uVar4 = uVar4 * 10;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
      power_ten = 0;
    }
    uVar9 = uVar4;
    if (power_ten < 0) {
      do {
        if (lVar7 < 0xccccccc) {
          lVar7 = lVar7 * 10;
        }
        else {
          a_ = a_ / 10;
        }
        if ((uVar9 < 10) && (a_ == 0)) {
          return 0;
        }
        uVar9 = uVar9 / 10;
        power_ten = power_ten + 1;
      } while (power_ten != 0);
    }
    if (a_ != 0) {
      FVar5 = FT_DivFix(a_,lVar7);
      uVar9 = uVar9 + FVar5;
    }
  }
LAB_0023483c:
  if (bVar10) {
    return -uVar9;
  }
  return uVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Fixed )
  PS_Conv_ToFixed( FT_Byte**  cursor,
                   FT_Byte*   limit,
                   FT_Long    power_ten )
  {
    FT_Byte*  p = *cursor;
    FT_Byte*  curp;

    FT_Fixed  integral = 0;
    FT_Long   decimal  = 0;
    FT_Long   divider  = 1;

    FT_Bool   sign           = 0;
    FT_Bool   have_overflow  = 0;
    FT_Bool   have_underflow = 0;


    if ( p >= limit )
      goto Bad;

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    /* read the integer part */
    if ( *p != '.' )
    {
      curp     = p;
      integral = PS_Conv_ToInt( &p, limit );

      if ( p == curp )
        return 0;

      if ( integral > 0x7FFF )
        have_overflow = 1;
      else
        integral = (FT_Fixed)( (FT_UInt32)integral << 16 );
    }

    /* read the decimal part */
    if ( p < limit && *p == '.' )
    {
      p++;

      for ( ; p < limit; p++ )
      {
        FT_Char  c;


        if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
          break;

        c = ft_char_table[*p & 0x7F];

        if ( c < 0 || c >= 10 )
          break;

        /* only add digit if we don't overflow */
        if ( divider < 0xCCCCCCCL && decimal < 0xCCCCCCCL )
        {
          decimal = decimal * 10 + c;

          if ( !integral && power_ten > 0 )
            power_ten--;
          else
            divider *= 10;
        }
      }
    }

    /* read exponent, if any */
    if ( p + 1 < limit && ( *p == 'e' || *p == 'E' ) )
    {
      FT_Long  exponent;


      p++;

      curp     = p;
      exponent = PS_Conv_ToInt( &p, limit );

      if ( curp == p )
        return 0;

      /* arbitrarily limit exponent */
      if ( exponent > 1000 )
        have_overflow = 1;
      else if ( exponent < -1000 )
        have_underflow = 1;
      else
        power_ten += exponent;
    }

    *cursor = p;

    if ( !integral && !decimal )
      return 0;

    if ( have_overflow )
      goto Overflow;
    if ( have_underflow )
      goto Underflow;

    while ( power_ten > 0 )
    {
      if ( integral >= 0xCCCCCCCL )
        goto Overflow;
      integral *= 10;

      if ( decimal >= 0xCCCCCCCL )
      {
        if ( divider == 1 )
          goto Overflow;
        divider /= 10;
      }
      else
        decimal *= 10;

      power_ten--;
    }

    while ( power_ten < 0 )
    {
      integral /= 10;
      if ( divider < 0xCCCCCCCL )
        divider *= 10;
      else
        decimal /= 10;

      if ( !integral && !decimal )
        goto Underflow;

      power_ten++;
    }

    if ( decimal )
    {
      decimal = FT_DivFix( decimal, divider );
      /* it's not necessary to check this addition for overflow */
      /* due to the structure of the real number representation */
      integral += decimal;
    }

  Exit:
    if ( sign )
      integral = -integral;

    return integral;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;

  Overflow:
    integral = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    return 0;
  }